

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixEigenExtensions.h
# Opt level: O1

void __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::ArchiveIN
          (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this,ChArchiveIn *marchive)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  size_t tot_elements;
  size_t m_col;
  size_t m_row;
  char idname [20];
  ulong local_78;
  char *local_70;
  ulong *local_68;
  undefined1 local_60;
  ulong local_58;
  ulong local_50;
  char local_48 [24];
  
  chrono::ChArchiveIn::VersionRead<chrono::ChMatrix_dense_version_tag>(marchive);
  local_70 = "rows";
  local_68 = &local_50;
  local_60 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[9])(marchive,&local_70);
  local_70 = "columns";
  local_68 = &local_58;
  local_60 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[9])(marchive,&local_70);
  if ((long)(local_58 | local_50) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  if ((local_58 != 0 && local_50 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_58),0) <
      (long)local_50)) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = chrono::ChStreamOutAscii::operator<<;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)this,local_58 * local_50,local_50,local_58);
  local_78 = *(long *)(this + 0x10) * *(long *)(this + 8);
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xe])(marchive,"data",&local_78);
  if (local_78 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      sprintf(local_48,"%lu",uVar3);
      if (*(long *)(this + 0x10) * *(long *)(this + 8) - uVar3 == 0 ||
          *(long *)(this + 0x10) * *(long *)(this + 8) < (long)uVar3) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                     );
      }
      local_68 = (ulong *)(*(long *)this + lVar2);
      local_60 = 0;
      local_70 = local_48;
      (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_70);
      (*(marchive->super_ChArchive)._vptr_ChArchive[0xf])(marchive,"data");
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar3 < local_78);
  }
  (*(marchive->super_ChArchive)._vptr_ChArchive[0x10])(marchive,"data");
  return;
}

Assistant:

void ArchiveIN(chrono::ChArchiveIn& marchive) {
    // suggested: use versioning
    /*int version =*/ marchive.VersionRead<chrono::ChMatrix_dense_version_tag>(); // btw use the ChMatrixDynamic version tag also for all other templates.
	
    // stream in all member data
    size_t m_row; 
	size_t m_col;
    marchive >> chrono::make_ChNameValue("rows", m_row);
    marchive >> chrono::make_ChNameValue("columns", m_col);
	
    derived().resize(m_row, m_col);

    // custom input of matrix data as array
    size_t tot_elements = derived().rows() * derived().cols();
    marchive.in_array_pre("data", tot_elements);
	char idname[20]; // only for xml, xml serialization needs unique element name
    for (size_t i = 0; i < tot_elements; i++) {
		sprintf(idname, "%lu", (unsigned long)i);
        marchive >> chrono::CHNVP(derived()((Eigen::Index)i), idname);
        marchive.in_array_between("data");
    }
    marchive.in_array_end("data");
}